

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

bool __thiscall
s2textformat::MakeLoop
          (s2textformat *this,string_view str,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop
          ,S2Debug debug_override)

{
  S2Loop *pSVar1;
  bool bVar2;
  int iVar3;
  size_type len;
  string_view str_00;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Debug local_71;
  S2Loop *local_70;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_68;
  string_view local_48;
  string_view local_38;
  
  str_00.ptr_ = str.ptr_;
  local_71 = (S2Debug)loop;
  absl::string_view::string_view(&local_38,"empty");
  if (((char *)local_38.length_ == str_00.ptr_) &&
     ((loop = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
              CONCAT71((int7)((ulong)loop >> 8),
                       str_00.ptr_ == (char *)0x0 || (s2textformat *)local_38.ptr_ == this),
      str_00.ptr_ == (char *)0x0 || (s2textformat *)local_38.ptr_ == this ||
      (iVar3 = bcmp(this,local_38.ptr_,(size_t)str_00.ptr_), iVar3 == 0)))) {
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[0] = 0.0;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[1] = 0.0;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[2] = 1.0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_70,&local_68);
  }
  else {
    absl::string_view::string_view(&local_48,"full");
    if (((char *)local_48.length_ != str_00.ptr_) ||
       ((loop = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                CONCAT71((int7)((ulong)loop >> 8),
                         str_00.ptr_ == (char *)0x0 || (s2textformat *)local_48.ptr_ == this),
        str_00.ptr_ != (char *)0x0 && (s2textformat *)local_48.ptr_ != this &&
        (iVar3 = bcmp(this,local_48.ptr_,(size_t)str_00.ptr_), iVar3 != 0)))) {
      local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      str_00.length_ = (size_type)&local_68;
      bVar2 = ParsePoints(this,str_00,
                          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)loop);
      if (bVar2) {
        absl::
        make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug&>
                  ((absl *)&local_70,&local_68,&local_71);
        pSVar1 = local_70;
        local_70 = (S2Loop *)0x0;
        std::__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>::reset
                  ((__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> *)str.length_,pSVar1);
        pSVar1 = local_70;
        if (local_70 != (S2Loop *)0x0) {
          S2Loop::~S2Loop(local_70);
          operator_delete(pSVar1);
        }
      }
      if (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar2;
      }
      operator_delete(local_68.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
      return bVar2;
    }
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[0] = 0.0;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[1] = 0.0;
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_[2] = -1.0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_70,&local_68);
  }
  pSVar1 = local_70;
  local_70 = (S2Loop *)0x0;
  std::__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>::reset
            ((__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> *)str.length_,pSVar1);
  pSVar1 = local_70;
  if (local_70 != (S2Loop *)0x0) {
    S2Loop::~S2Loop(local_70);
    operator_delete(pSVar1);
  }
  local_70 = (S2Loop *)0x0;
  if (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool MakeLoop(string_view str, unique_ptr<S2Loop>* loop,
              S2Debug debug_override) {
  if (str == "empty") {
    *loop = make_unique<S2Loop>(S2Loop::kEmpty());
    return true;
  }
  if (str == "full") {
    *loop = make_unique<S2Loop>(S2Loop::kFull());
    return true;
  }
  vector<S2Point> vertices;
  if (!ParsePoints(str, &vertices)) return false;
  *loop = make_unique<S2Loop>(vertices, debug_override);
  return true;
}